

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

DataSegment * wasm::ModuleUtils::copyDataSegment(DataSegment *segment,Module *out)

{
  char *pcVar1;
  Expression *pEVar2;
  DataSegment *pDVar3;
  bool in_CL;
  string_view sVar4;
  string_view sVar5;
  Name memory;
  Name name;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Module *local_40;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_38;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> ret;
  
  local_40 = out;
  sVar4 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbe8acc),in_CL);
  memory.super_IString.str._M_len = sVar4._M_str;
  sVar5 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbe8acc),in_CL);
  memory.super_IString.str._M_str = (char *)sVar5._M_len;
  name.super_IString.str._M_str = (char *)sVar4._M_len;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeDataSegment
            (name,memory,sVar5._M_str._0_1_,(Expression *)0x0,(char *)0x0,(Address)0xbe8acc);
  pcVar1 = (segment->super_Named).name.super_IString.str._M_str;
  ((local_38._M_head_impl)->super_Named).name.super_IString.str._M_len =
       (segment->super_Named).name.super_IString.str._M_len;
  ((local_38._M_head_impl)->super_Named).name.super_IString.str._M_str = pcVar1;
  ((local_38._M_head_impl)->super_Named).hasExplicitName = (segment->super_Named).hasExplicitName;
  pcVar1 = (segment->memory).super_IString.str._M_str;
  ((local_38._M_head_impl)->memory).super_IString.str._M_len =
       (segment->memory).super_IString.str._M_len;
  ((local_38._M_head_impl)->memory).super_IString.str._M_str = pcVar1;
  (local_38._M_head_impl)->isPassive = segment->isPassive;
  if (segment->isPassive == false) {
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h:72:15)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h:72:15)>
               ::_M_manager;
    pEVar2 = ExpressionManipulator::flexibleCopy(segment->offset,local_40,(CustomCopier *)&local_68)
    ;
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    (local_38._M_head_impl)->offset = pEVar2;
  }
  std::vector<char,_std::allocator<char>_>::operator=(&(local_38._M_head_impl)->data,&segment->data)
  ;
  pDVar3 = Module::addDataSegment
                     (local_40,(unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                *)&local_38);
  if (local_38._M_head_impl != (DataSegment *)0x0) {
    std::default_delete<wasm::DataSegment>::operator()
              ((default_delete<wasm::DataSegment> *)&local_38,local_38._M_head_impl);
  }
  return pDVar3;
}

Assistant:

inline DataSegment* copyDataSegment(const DataSegment* segment, Module& out) {
  auto ret = Builder::makeDataSegment();
  ret->name = segment->name;
  ret->hasExplicitName = segment->hasExplicitName;
  ret->memory = segment->memory;
  ret->isPassive = segment->isPassive;
  if (!segment->isPassive) {
    auto offset = ExpressionManipulator::copy(segment->offset, out);
    ret->offset = offset;
  }
  ret->data = segment->data;

  return out.addDataSegment(std::move(ret));
}